

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlCtxtGrowAttrs(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar **ppxVar2;
  uint *puVar3;
  int newSize;
  uint *attallocs;
  xmlChar **atts;
  xmlParserCtxtPtr ctxt_local;
  
  iVar1 = xmlGrowCapacity(ctxt->maxatts / 5,0x2c,10,100000000);
  if (iVar1 < 0) {
    xmlFatalErr(ctxt,XML_ERR_RESOURCE_LIMIT,"Maximum number of attributes exceeded");
  }
  else {
    ppxVar2 = (xmlChar **)(*xmlRealloc)(ctxt->atts,(long)iVar1 * 0x28);
    if (ppxVar2 != (xmlChar **)0x0) {
      ctxt->atts = ppxVar2;
      puVar3 = (uint *)(*xmlRealloc)(ctxt->attallocs,(long)iVar1 << 2);
      if (puVar3 != (uint *)0x0) {
        ctxt->attallocs = puVar3;
        ctxt->maxatts = iVar1 * 5;
        return 0;
      }
    }
    xmlErrMemory(ctxt);
  }
  return -1;
}

Assistant:

static int
xmlCtxtGrowAttrs(xmlParserCtxtPtr ctxt) {
    const xmlChar **atts;
    unsigned *attallocs;
    int newSize;

    newSize = xmlGrowCapacity(ctxt->maxatts / 5,
                              sizeof(atts[0]) * 5 + sizeof(attallocs[0]),
                              10, XML_MAX_ATTRS);
    if (newSize < 0) {
        xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT,
                    "Maximum number of attributes exceeded");
        return(-1);
    }

    atts = xmlRealloc(ctxt->atts, newSize * sizeof(atts[0]) * 5);
    if (atts == NULL)
        goto mem_error;
    ctxt->atts = atts;

    attallocs = xmlRealloc(ctxt->attallocs,
                           newSize * sizeof(attallocs[0]));
    if (attallocs == NULL)
        goto mem_error;
    ctxt->attallocs = attallocs;

    ctxt->maxatts = newSize * 5;

    return(0);

mem_error:
    xmlErrMemory(ctxt);
    return(-1);
}